

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<signed_char,char,short,char,int,char,long_long>
          (String *__return_storage_ptr__,kj *this,char *params,char *params_1,short *params_2,
          char *params_3,int *params_4,char *params_5,longlong *params_6)

{
  CappedArray<char,_5UL> CVar1;
  CappedArray<char,_26UL> *in_stack_ffffffffffffff58;
  undefined1 local_9b [2];
  undefined1 local_99 [33];
  CappedArray<char,_8UL> local_78;
  size_t local_68;
  undefined4 local_60;
  char local_5c;
  CappedArray<char,_26UL> local_58;
  
  local_99._1_8_ = params_3;
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(char)*this);
  local_68 = CVar1.currentSize;
  local_60 = CVar1.content._0_4_;
  local_5c = CVar1.content[4];
  local_9b[1] = *params;
  local_78 = _::Stringifier::operator*((Stringifier *)&_::STR,*(short *)params_1);
  local_9b[0] = (undefined1)*params_2;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_99 + 9),(Stringifier *)&_::STR,*(int *)local_99._1_8_
            );
  local_99[0] = (undefined1)*params_4;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(longlong *)params_5);
  _::
  concat<kj::CappedArray<char,5ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_68,(CappedArray<char,_5UL> *)(local_9b + 1),
             (FixedArray<char,_1UL> *)&local_78,(CappedArray<char,_8UL> *)local_9b,
             (FixedArray<char,_1UL> *)(local_99 + 9),(CappedArray<char,_14UL> *)local_99,
             (FixedArray<char,_1UL> *)&local_58,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}